

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_serialize_totext(FILE *out)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  avl_iter_t *iter;
  lddmc_ser *plVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  
  iter = avl_iter(lddmc_ser_reversed_set);
  fputc(0x5b,(FILE *)out);
  while( true ) {
    plVar4 = lddmc_ser_reversed_iter_next(iter);
    if (plVar4 == (lddmc_ser *)0x0) break;
    sVar2 = plVar4->assigned;
    lVar7 = plVar4->mdd * 0x10;
    puVar3 = nodes->data;
    uVar1 = *(uint *)(puVar3 + lVar7 + 6);
    sVar5 = lddmc_serialize_get(*(ulong *)(puVar3 + lVar7 + 8) >> 0x11);
    sVar6 = lddmc_serialize_get(*(ulong *)(puVar3 + lVar7) >> 1 & 0x7fffffffffff);
    fprintf((FILE *)out,"(%zu,v=%u,d=%zu,r=%zu),",sVar2,(ulong)uVar1,sVar5,sVar6);
  }
  fputc(0x5d,(FILE *)out);
  free(iter);
  return;
}

Assistant:

void
lddmc_serialize_totext(FILE *out)
{
    avl_iter_t *it = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);
    struct lddmc_ser *s;

    fprintf(out, "[");
    while ((s=lddmc_ser_reversed_iter_next(it))) {
        MDD mdd = s->mdd;
        mddnode_t n = LDD_GETNODE(mdd);
        fprintf(out, "(%zu,v=%u,d=%zu,r=%zu),", s->assigned,
                                                mddnode_getvalue(n),
                                                lddmc_serialize_get(mddnode_getdown(n)),
                                                lddmc_serialize_get(mddnode_getright(n)));
    }
    fprintf(out, "]");

    lddmc_ser_reversed_iter_free(it);
}